

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

void __thiscall
QNetworkHeadersPrivate::setHeaders(QNetworkHeadersPrivate *this,QHttpHeaders *newHeaders)

{
  QNetworkHeadersPrivate *in_RSI;
  QHttpHeaders *in_RDI;
  QHttpHeaders *in_stack_00000030;
  QNetworkHeadersPrivate *in_stack_00000038;
  
  QHttpHeaders::operator=((QHttpHeaders *)in_RSI,in_RDI);
  setCookedFromHttp(in_stack_00000038,in_stack_00000030);
  invalidateHeaderCache(in_RSI);
  return;
}

Assistant:

void QNetworkHeadersPrivate::setHeaders(QHttpHeaders &&newHeaders)
{
    httpHeaders = std::move(newHeaders);
    setCookedFromHttp(httpHeaders);
    invalidateHeaderCache();
}